

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O2

void __thiscall QPDF::JSONReactor::containerEnd(JSONReactor *this,JSON *value)

{
  state_e sVar1;
  pointer pSVar2;
  byte bVar3;
  qpdf_offset_t qVar4;
  allocator<char> local_41;
  string local_40;
  
  sVar1 = (this->stack).
          super__Vector_base<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].state;
  std::vector<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>::
  pop_back(&this->stack);
  if ((this->stack).
      super__Vector_base<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->stack).
      super__Vector_base<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (this->saw_qpdf == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"\"qpdf\" object was not seen",&local_41);
      error(this,0,&local_40);
    }
    else {
      if (this->saw_json_version == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"\"qpdf[0].jsonversion\" was not seen",&local_41);
        error(this,0,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
      }
      if ((this->must_be_complete == true) && (this->saw_pdf_version == false)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"\"qpdf[0].pdfversion\" was not seen",&local_41);
        error(this,0,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
      }
      if (this->saw_objects == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"\"qpdf[1]\" was not seen",&local_41);
        error(this,0,&local_40);
      }
      else {
        if ((this->must_be_complete != true) || (this->saw_trailer != false)) goto LAB_001d05d2;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"\"qpdf[1].trailer\" was not seen",&local_41);
        error(this,0,&local_40);
      }
    }
  }
  else if (sVar1 == st_object_top) {
    bVar3 = this->saw_stream;
    if (this->saw_value == (bool)bVar3) {
      qVar4 = JSON::getStart(value);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"object must have exactly one of \"value\" or \"stream\"",
                 &local_41);
      error(this,qVar4,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      bVar3 = this->saw_stream;
    }
    if ((bVar3 & 1) == 0) goto LAB_001d05d2;
    if (this->saw_dict == false) {
      qVar4 = JSON::getStart(value);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"\"stream\" is missing \"dict\"",&local_41);
      error(this,qVar4,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
    if (this->saw_data != this->saw_datafile) goto LAB_001d05d2;
    if (this->this_stream_needs_data == true) {
      qVar4 = JSON::getStart(value);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,
                 "new \"stream\" must have exactly one of \"data\" or \"datafile\"",&local_41);
      error(this,qVar4,&local_40);
    }
    else {
      if (this->saw_datafile == false) goto LAB_001d05d2;
      qVar4 = JSON::getStart(value);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,
                 "existing \"stream\" may at most one of \"data\" or \"datafile\"",&local_41);
      error(this,qVar4,&local_40);
    }
  }
  else {
    if ((sVar1 != st_trailer) || (this->saw_value != false)) goto LAB_001d05d2;
    qVar4 = JSON::getStart(value);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"\"trailer\" is missing \"value\"",&local_41);
    error(this,qVar4,&local_40);
  }
  std::__cxx11::string::~string((string *)&local_40);
LAB_001d05d2:
  pSVar2 = (this->stack).
           super__Vector_base<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((this->stack).
       super__Vector_base<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>
       ._M_impl.super__Vector_impl_data._M_start != pSVar2) && (pSVar2[-1].state == st_objects)) {
    std::__cxx11::string::assign((char *)&this->cur_object);
    this->saw_value = false;
    this->saw_stream = false;
    this->saw_dict = false;
    this->saw_data = false;
    this->saw_datafile = false;
  }
  return;
}

Assistant:

void
QPDF::JSONReactor::containerEnd(JSON const& value)
{
    auto from_state = stack.back().state;
    stack.pop_back();
    if (stack.empty()) {
        if (!this->saw_qpdf) {
            QTC::TC("qpdf", "QPDF_json missing qpdf");
            error(0, "\"qpdf\" object was not seen");
        } else {
            if (!this->saw_json_version) {
                QTC::TC("qpdf", "QPDF_json missing json version");
                error(0, "\"qpdf[0].jsonversion\" was not seen");
            }
            if (must_be_complete && !this->saw_pdf_version) {
                QTC::TC("qpdf", "QPDF_json missing pdf version");
                error(0, "\"qpdf[0].pdfversion\" was not seen");
            }
            if (!this->saw_objects) {
                QTC::TC("qpdf", "QPDF_json missing objects");
                error(0, "\"qpdf[1]\" was not seen");
            } else {
                if (must_be_complete && !this->saw_trailer) {
                    QTC::TC("qpdf", "QPDF_json missing trailer");
                    error(0, "\"qpdf[1].trailer\" was not seen");
                }
            }
        }
    } else if (from_state == st_trailer) {
        if (!saw_value) {
            QTC::TC("qpdf", "QPDF_json trailer no value");
            error(value.getStart(), "\"trailer\" is missing \"value\"");
        }
    } else if (from_state == st_object_top) {
        if (saw_value == saw_stream) {
            QTC::TC("qpdf", "QPDF_json value stream both or neither");
            error(value.getStart(), "object must have exactly one of \"value\" or \"stream\"");
        }
        if (saw_stream) {
            if (!saw_dict) {
                QTC::TC("qpdf", "QPDF_json stream no dict");
                error(value.getStart(), "\"stream\" is missing \"dict\"");
            }
            if (saw_data == saw_datafile) {
                if (this_stream_needs_data) {
                    QTC::TC("qpdf", "QPDF_json data datafile both or neither");
                    error(
                        value.getStart(),
                        "new \"stream\" must have exactly one of \"data\" or \"datafile\"");
                } else if (saw_datafile) {
                    QTC::TC("qpdf", "QPDF_json data and datafile");
                    error(
                        value.getStart(),
                        "existing \"stream\" may at most one of \"data\" or \"datafile\"");
                } else {
                    QTC::TC("qpdf", "QPDF_json no stream data in update mode");
                }
            }
        }
    }
    if (!stack.empty()) {
        auto state = stack.back().state;
        if (state == st_objects) {
            this->cur_object = "";
            this->saw_dict = false;
            this->saw_data = false;
            this->saw_datafile = false;
            this->saw_value = false;
            this->saw_stream = false;
        }
    }
}